

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlvideo.cpp
# Opt level: O2

void __thiscall SDLFB::SDLFB(SDLFB *this,int width,int height,bool fullscreen,SDL_Window *oldwin)

{
  BYTE BVar1;
  char *pcVar2;
  char *pcVar3;
  SDL_Window *pSVar4;
  long lVar5;
  undefined8 uVar6;
  FString caption;
  
  DFrameBuffer::DFrameBuffer(&this->super_DFrameBuffer,width,height);
  (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_007bd4b0;
  this->NeedPalUpdate = false;
  this->NeedGammaUpdate = false;
  this->UpdatePending = false;
  this->NotPaletted = false;
  this->FlashAmount = 0;
  if (oldwin == (SDL_Window *)0x0) {
    caption.Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    pcVar2 = GetVersionString();
    pcVar3 = GetGitTime();
    FString::Format(&caption,"GZDOOM %s (%s)",pcVar2,pcVar3);
    uVar6 = 0x20;
    if (fullscreen) {
      uVar6 = 0x1021;
    }
    pSVar4 = (SDL_Window *)
             SDL_CreateWindow(caption.Chars,vid_adapter.Value | 0x1fff0000U,
                              vid_adapter.Value | 0x1fff0000U,width,height,uVar6);
    this->Screen = pSVar4;
    FString::~FString(&caption);
    if (pSVar4 == (SDL_Window *)0x0) {
      return;
    }
  }
  else {
    this->Screen = oldwin;
    SDL_SetWindowSize(oldwin,width,height);
    SetFullscreen(this,fullscreen);
  }
  this->Renderer = (SDL_Renderer *)0x0;
  (this->field_8).Texture = (SDL_Texture *)0x0;
  ResetSDLRenderer(this);
  for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
    BVar1 = (BYTE)lVar5;
    this->GammaTable[2][lVar5] = BVar1;
    this->GammaTable[1][lVar5] = BVar1;
    this->GammaTable[0][lVar5] = BVar1;
  }
  memcpy(this->SourcePalette,&GPalette,0x400);
  UpdateColors(this);
  return;
}

Assistant:

SDLFB::SDLFB (int width, int height, bool fullscreen, SDL_Window *oldwin)
	: DFrameBuffer (width, height)
{
	int i;
	
	NeedPalUpdate = false;
	NeedGammaUpdate = false;
	UpdatePending = false;
	NotPaletted = false;
	FlashAmount = 0;

	if (oldwin)
	{
		// In some cases (Mac OS X fullscreen) SDL2 doesn't like having multiple windows which
		// appears to inevitably happen while compositor animations are running. So lets try
		// to reuse the existing window.
		Screen = oldwin;
		SDL_SetWindowSize (Screen, width, height);
		SetFullscreen (fullscreen);
	}
	else
	{
		FString caption;
		caption.Format(GAMESIG " %s (%s)", GetVersionString(), GetGitTime());

		Screen = SDL_CreateWindow (caption,
			SDL_WINDOWPOS_UNDEFINED_DISPLAY(vid_adapter), SDL_WINDOWPOS_UNDEFINED_DISPLAY(vid_adapter),
			width, height, (fullscreen ? SDL_WINDOW_FULLSCREEN_DESKTOP : 0)|SDL_WINDOW_RESIZABLE);

		if (Screen == NULL)
			return;
	}

	Renderer = NULL;
	Texture = NULL;
	ResetSDLRenderer ();

	for (i = 0; i < 256; i++)
	{
		GammaTable[0][i] = GammaTable[1][i] = GammaTable[2][i] = i;
	}

	memcpy (SourcePalette, GPalette.BaseColors, sizeof(PalEntry)*256);
	UpdateColors ();

#ifdef __APPLE__
	SetVSync (vid_vsync > 0);
#endif
}